

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_chart_end(nk_context *ctx)

{
  nk_chart *__s;
  ulong uVar1;
  ulong uVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5df2,"void nk_chart_end(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    __s = &ctx->current->layout->chart;
    uVar1 = (ulong)__s & 3;
    if (uVar1 == 0) {
      uVar2 = 0xb4;
    }
    else {
      memset(__s,0,4 - uVar1);
      uVar2 = uVar1 | 0xb0;
      __s = (nk_chart *)((long)__s + (4 - uVar1));
    }
    uVar1 = (ulong)((uint)uVar2 & 0xfffffffc);
    memset(__s,0,uVar1);
    if ((uVar2 & 3) != 0) {
      memset((void *)((long)__s->slots + (uVar1 - 0x14)),0,uVar2 & 3);
      return;
    }
    return;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x5df3,"void nk_chart_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_chart_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_chart *chart;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return;

    win = ctx->current;
    chart = &win->layout->chart;
    NK_MEMSET(chart, 0, sizeof(*chart));
    return;
}